

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kdtree.cpp
# Opt level: O2

void __thiscall Kdtree::print_data(Kdtree *this,vector<float,_std::allocator<float>_> *pt)

{
  pointer pfVar1;
  ostream *poVar2;
  int i;
  ulong uVar3;
  
  for (uVar3 = 0;
      pfVar1 = (pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(pt->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)pfVar1 >> 2);
      uVar3 = uVar3 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pfVar1[uVar3]);
    std::operator<<(poVar2,", ");
  }
  std::operator<<((ostream *)&std::cout,"\n");
  return;
}

Assistant:

void Kdtree::print_data(std::vector<numType> pt)
{
	for( auto i = 0; i < pt.size(); i++)
	{
	    std::cout<< pt[i] << ", ";
	}
	std::cout<<"\n";
}